

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcActor.super_IfcObject.field_0x48;
  *(undefined8 *)&this[-1].super_IfcActor.super_IfcObject.field_0x48 = 0x869328;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x30 = 0x8693f0;
  *(undefined8 *)&this[-1].super_IfcActor.super_IfcObject.field_0xd0 = 0x869350;
  *(undefined8 *)&this[-1].super_IfcActor.super_IfcObject.field_0xe0 = 0x869378;
  *(undefined8 *)&this[-1].field_0x118 = 0x8693a0;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0x8693c8;
  puVar1 = *(undefined1 **)&(this->super_IfcActor).super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcActor).super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcActor::~IfcActor((IfcActor *)this_00,&PTR_construction_vtable_24__00869408);
  operator_delete(this_00,0x138);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}